

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es5503.c
# Opt level: O0

UINT8 es5503_r(void *info,UINT8 offset)

{
  byte bVar1;
  byte bVar2;
  UINT8 UVar3;
  UINT8 osc;
  ES5503Chip *chip;
  int i;
  UINT8 retval;
  UINT8 offset_local;
  void *info_local;
  
  if (offset < 0xe0) {
    bVar1 = offset & 0x1f;
    bVar2 = offset & 0xe0;
    if ((offset & 0xe0) == 0) {
      return (UINT8)*(undefined2 *)((long)info + (ulong)bVar1 * 0x18 + 0x38);
    }
    if (bVar2 == 0x20) {
      return (UINT8)((ushort)*(undefined2 *)((long)info + (ulong)bVar1 * 0x18 + 0x38) >> 8);
    }
    if (bVar2 == 0x40) {
      return *(UINT8 *)((long)info + (ulong)bVar1 * 0x18 + 0x3d);
    }
    if (bVar2 == 0x60) {
      return *(UINT8 *)((long)info + (ulong)bVar1 * 0x18 + 0x3e);
    }
    if (bVar2 == 0x80) {
      return (UINT8)((uint)*(undefined4 *)((long)info + (ulong)bVar1 * 0x18 + 0x40) >> 8);
    }
    if (bVar2 == 0xa0) {
      return *(UINT8 *)((long)info + (ulong)bVar1 * 0x18 + 0x3c);
    }
    if (bVar2 == 0xc0) {
      chip._6_1_ = 0;
      if ((*(uint *)((long)info + (ulong)bVar1 * 0x18 + 0x40) & 0x10000) != 0) {
        chip._6_1_ = 0x40;
      }
      return chip._6_1_ | *(char *)((long)info + (ulong)bVar1 * 0x18 + 0x44) << 3 |
             *(byte *)((long)info + (ulong)bVar1 * 0x18 + 0x45);
    }
  }
  else {
    if (offset == 0xe0) {
      chip._6_1_ = *(byte *)((long)info + 0x339);
      if (*(long *)((long)info + 0x18) != 0) {
        (**(code **)((long)info + 0x18))(*(undefined8 *)((long)info + 0x20),0);
      }
      chip._0_4_ = 0;
      do {
        if ((int)(uint)*(byte *)((long)info + 0x338) <= (int)chip) {
LAB_001cee23:
          chip._0_4_ = 0;
          while( true ) {
            if ((int)(uint)*(byte *)((long)info + 0x338) <= (int)chip) {
              return chip._6_1_;
            }
            if (*(char *)((long)info + (long)(int)chip * 0x18 + 0x4c) != '\0') break;
            chip._0_4_ = (int)chip + 1;
          }
          if (*(long *)((long)info + 0x18) == 0) {
            return chip._6_1_;
          }
          (**(code **)((long)info + 0x18))(*(undefined8 *)((long)info + 0x20),1);
          return chip._6_1_;
        }
        if (*(char *)((long)info + (long)(int)chip * 0x18 + 0x4c) != '\0') {
          chip._6_1_ = (byte)((int)chip << 1);
          *(byte *)((long)info + 0x339) = chip._6_1_ | 0x80;
          *(undefined1 *)((long)info + (long)(int)chip * 0x18 + 0x4c) = 0;
          goto LAB_001cee23;
        }
        chip._0_4_ = (int)chip + 1;
      } while( true );
    }
    if (offset == 0xe1) {
      return (*(char *)((long)info + 0x338) + -1) * '\x02';
    }
    if ((offset == 0xe2) && (*(long *)((long)info + 0x28) != 0)) {
      UVar3 = (**(code **)((long)info + 0x28))(*(undefined8 *)((long)info + 0x30),0);
      return UVar3;
    }
  }
  return '\0';
}

Assistant:

static UINT8 es5503_r(void *info, UINT8 offset)
{
	UINT8 retval;
	int i;
	ES5503Chip *chip = (ES5503Chip *)info;

	if (offset < 0xe0)
	{
		UINT8 osc = offset & 0x1f;

		switch(offset & 0xe0)
		{
			case 0:     // freq lo
				return (chip->oscillators[osc].freq & 0xff);

			case 0x20:      // freq hi
				return (chip->oscillators[osc].freq >> 8);

			case 0x40:  // volume
				return chip->oscillators[osc].vol;

			case 0x60:  // data
				return chip->oscillators[osc].data;

			case 0x80:  // wavetable pointer
				return (chip->oscillators[osc].wavetblpointer>>8) & 0xff;

			case 0xa0:  // oscillator control
				return chip->oscillators[osc].control;

			case 0xc0:  // bank select / wavetable size / resolution
				retval = 0;
				if (chip->oscillators[osc].wavetblpointer & 0x10000)
				{
					retval |= 0x40;
				}

				retval |= (chip->oscillators[osc].wavetblsize<<3);
				retval |= chip->oscillators[osc].resolution;
				return retval;
		}
	}
	else     // global registers
	{
		switch (offset)
		{
			case 0xe0:  // interrupt status
				retval = chip->rege0;

				if (chip->irq_func != NULL)
					chip->irq_func(chip->irq_param, 0);

				// scan all oscillators
				for (i = 0; i < chip->oscsenabled; i++)
				{
					if (chip->oscillators[i].irqpend)
					{
						// signal this oscillator has an interrupt
						retval = i<<1;

						chip->rege0 = retval | 0x80;

						// and clear its flag
						chip->oscillators[i].irqpend = 0;
						break;
					}
				}

				// if any oscillators still need to be serviced, assert IRQ again immediately
				for (i = 0; i < chip->oscsenabled; i++)
				{
					if (chip->oscillators[i].irqpend)
					{
						if (chip->irq_func != NULL)
							chip->irq_func(chip->irq_param, 1);
						break;
					}
				}

				return retval;

			case 0xe1:  // oscillator enable
				return (chip->oscsenabled-1)<<1;

			case 0xe2:  // A/D converter
				if (chip->adc_func != NULL)
					return chip->adc_func(chip->adc_param, 0);
				break;
		}
	}

	return 0;
}